

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  uchar uVar1;
  bool bVar2;
  sqlite3_index_constraint *psVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  char local_85;
  int local_84;
  u8 op;
  int jj;
  sqlite3_index_constraint *p;
  char zIdxStr [41];
  int local_44;
  int iIdx;
  i64 nRow;
  int local_30;
  int bMatch;
  int ii;
  int rc;
  Rtree *pRtree;
  sqlite3_index_info *pIdxInfo_local;
  sqlite3_vtab *tab_local;
  
  bVar2 = false;
  local_44 = 0;
  memset(&p,0,0x29);
  for (local_30 = 0; local_30 < pIdxInfo->nConstraint; local_30 = local_30 + 1) {
    if (pIdxInfo->aConstraint[local_30].op == '@') {
      bVar2 = true;
    }
  }
  local_30 = 0;
  while( true ) {
    if (pIdxInfo->nConstraint <= local_30 || 0x27 < local_44) {
      pIdxInfo->idxNum = 2;
      pIdxInfo->needToFreeIdxStr = 1;
      if (0 < local_44) {
        pcVar4 = sqlite3_mprintf("%s",&p);
        pIdxInfo->idxStr = pcVar4;
        if (pcVar4 == (char *)0x0) {
          return 7;
        }
      }
      lVar5 = (long)tab[3].pModule >> ((byte)(local_44 / 2) & 0x3f);
      pIdxInfo->estimatedCost = (double)lVar5 * 6.0;
      pIdxInfo->estimatedRows = lVar5;
      return 0;
    }
    psVar3 = pIdxInfo->aConstraint + local_30;
    if ((((!bVar2) && (psVar3->usable != '\0')) && (psVar3->iColumn == 0)) && (psVar3->op == '\x02')
       ) break;
    if ((psVar3->usable != '\0') &&
       (((0 < psVar3->iColumn && (psVar3->iColumn <= (int)(uint)(byte)tab[1].field_0xd)) ||
        (psVar3->op == '@')))) {
      uVar1 = psVar3->op;
      if (uVar1 == '\x02') {
        local_85 = 'A';
      }
      else if (uVar1 == '\x04') {
        local_85 = 'E';
      }
      else if (uVar1 == '\b') {
        local_85 = 'B';
      }
      else if (uVar1 == '\x10') {
        local_85 = 'C';
      }
      else if (uVar1 == ' ') {
        local_85 = 'D';
      }
      else if (uVar1 == '@') {
        local_85 = 'F';
      }
      else {
        local_85 = '\0';
      }
      if (local_85 != '\0') {
        iVar6 = local_44 + 1;
        zIdxStr[(long)local_44 + -8] = local_85;
        local_44 = local_44 + 2;
        zIdxStr[(long)iVar6 + -8] = (char)psVar3->iColumn + '/';
        pIdxInfo->aConstraintUsage[local_30].argvIndex = local_44 / 2;
        pIdxInfo->aConstraintUsage[local_30].omit = '\x01';
      }
    }
    local_30 = local_30 + 1;
  }
  for (local_84 = 0; local_84 < local_30; local_84 = local_84 + 1) {
    pIdxInfo->aConstraintUsage[local_84].argvIndex = 0;
    pIdxInfo->aConstraintUsage[local_84].omit = '\0';
  }
  pIdxInfo->idxNum = 1;
  pIdxInfo->aConstraintUsage[local_30].argvIndex = 1;
  pIdxInfo->aConstraintUsage[local_84].omit = '\x01';
  pIdxInfo->estimatedCost = 30.0;
  pIdxInfo->estimatedRows = 1;
  pIdxInfo->idxFlags = 1;
  return 0;
}

Assistant:

static int rtreeBestIndex(sqlite3_vtab *tab, sqlite3_index_info *pIdxInfo){
  Rtree *pRtree = (Rtree*)tab;
  int rc = SQLITE_OK;
  int ii;
  int bMatch = 0;                 /* True if there exists a MATCH constraint */
  i64 nRow;                       /* Estimated rows returned by this scan */

  int iIdx = 0;
  char zIdxStr[RTREE_MAX_DIMENSIONS*8+1];
  memset(zIdxStr, 0, sizeof(zIdxStr));

  /* Check if there exists a MATCH constraint - even an unusable one. If there
  ** is, do not consider the lookup-by-rowid plan as using such a plan would
  ** require the VDBE to evaluate the MATCH constraint, which is not currently
  ** possible. */
  for(ii=0; ii<pIdxInfo->nConstraint; ii++){
    if( pIdxInfo->aConstraint[ii].op==SQLITE_INDEX_CONSTRAINT_MATCH ){
      bMatch = 1;
    }
  }

  assert( pIdxInfo->idxStr==0 );
  for(ii=0; ii<pIdxInfo->nConstraint && iIdx<(int)(sizeof(zIdxStr)-1); ii++){
    struct sqlite3_index_constraint *p = &pIdxInfo->aConstraint[ii];

    if( bMatch==0 && p->usable 
     && p->iColumn==0 && p->op==SQLITE_INDEX_CONSTRAINT_EQ 
    ){
      /* We have an equality constraint on the rowid. Use strategy 1. */
      int jj;
      for(jj=0; jj<ii; jj++){
        pIdxInfo->aConstraintUsage[jj].argvIndex = 0;
        pIdxInfo->aConstraintUsage[jj].omit = 0;
      }
      pIdxInfo->idxNum = 1;
      pIdxInfo->aConstraintUsage[ii].argvIndex = 1;
      pIdxInfo->aConstraintUsage[jj].omit = 1;

      /* This strategy involves a two rowid lookups on an B-Tree structures
      ** and then a linear search of an R-Tree node. This should be 
      ** considered almost as quick as a direct rowid lookup (for which 
      ** sqlite uses an internal cost of 0.0). It is expected to return
      ** a single row.
      */ 
      pIdxInfo->estimatedCost = 30.0;
      pIdxInfo->estimatedRows = 1;
      pIdxInfo->idxFlags = SQLITE_INDEX_SCAN_UNIQUE;
      return SQLITE_OK;
    }

    if( p->usable
    && ((p->iColumn>0 && p->iColumn<=pRtree->nDim2)
        || p->op==SQLITE_INDEX_CONSTRAINT_MATCH)
    ){
      u8 op;
      switch( p->op ){
        case SQLITE_INDEX_CONSTRAINT_EQ:    op = RTREE_EQ;    break;
        case SQLITE_INDEX_CONSTRAINT_GT:    op = RTREE_GT;    break;
        case SQLITE_INDEX_CONSTRAINT_LE:    op = RTREE_LE;    break;
        case SQLITE_INDEX_CONSTRAINT_LT:    op = RTREE_LT;    break;
        case SQLITE_INDEX_CONSTRAINT_GE:    op = RTREE_GE;    break;
        case SQLITE_INDEX_CONSTRAINT_MATCH: op = RTREE_MATCH; break;
        default:                            op = 0;           break;
      }
      if( op ){
        zIdxStr[iIdx++] = op;
        zIdxStr[iIdx++] = (char)(p->iColumn - 1 + '0');
        pIdxInfo->aConstraintUsage[ii].argvIndex = (iIdx/2);
        pIdxInfo->aConstraintUsage[ii].omit = 1;
      }
    }
  }

  pIdxInfo->idxNum = 2;
  pIdxInfo->needToFreeIdxStr = 1;
  if( iIdx>0 && 0==(pIdxInfo->idxStr = sqlite3_mprintf("%s", zIdxStr)) ){
    return SQLITE_NOMEM;
  }

  nRow = pRtree->nRowEst >> (iIdx/2);
  pIdxInfo->estimatedCost = (double)6.0 * (double)nRow;
  pIdxInfo->estimatedRows = nRow;

  return rc;
}